

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz77.cpp
# Opt level: O1

options * parse(options *__return_storage_ptr__,options *opt,int *ptr,char **argv,int argc)

{
  bool bVar1;
  undefined6 uVar2;
  int iVar3;
  ostream *poVar4;
  undefined8 extraout_RAX;
  long lVar5;
  long *plVar6;
  char *pcVar7;
  int block_size;
  string s;
  string sep;
  allocator local_1f5;
  int local_1f4;
  char *local_1f0;
  long local_1e8;
  char local_1e0 [16];
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  symbol *local_1b0;
  long local_1a8;
  symbol local_1a0 [104];
  ios_base local_138 [264];
  
  std::__cxx11::string::string((string *)&local_1f0,argv[*ptr],(allocator *)&local_1b0);
  *ptr = *ptr + 1;
  iVar3 = std::__cxx11::string::compare((char *)&local_1f0);
  if (iVar3 == 0) {
    opt->lz_variant = v1;
LAB_0010799e:
    __return_storage_ptr__->mode = opt->mode;
    __return_storage_ptr__->verbose = opt->verbose;
    *(undefined2 *)&__return_storage_ptr__->field_0x5 = *(undefined2 *)&opt->field_0x5;
    __return_storage_ptr__->field_0x7 = opt->field_0x7;
    __return_storage_ptr__->lz_variant = opt->lz_variant;
    *(undefined4 *)&__return_storage_ptr__->field_0xc = *(undefined4 *)&opt->field_0xc;
    __return_storage_ptr__->block = opt->block;
    bVar1 = opt->prepend_alphabet;
    uVar2 = *(undefined6 *)&opt->field_0x1a;
    __return_storage_ptr__->sep = opt->sep;
    __return_storage_ptr__->prepend_alphabet = bVar1;
    *(undefined6 *)&__return_storage_ptr__->field_0x1a = uVar2;
    if (local_1f0 != local_1e0) {
      operator_delete(local_1f0);
    }
    return __return_storage_ptr__;
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_1f0);
  if (iVar3 == 0) {
    opt->lz_variant = v2;
    goto LAB_0010799e;
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_1f0);
  if (iVar3 == 0) {
    if (*ptr < argc) {
      std::__cxx11::string::string((string *)local_1d0,argv[*ptr],&local_1f5);
      std::__cxx11::istringstream::istringstream
                ((istringstream *)&local_1b0,(string *)local_1d0,_S_in);
      std::istream::operator>>((istream *)&local_1b0,&local_1f4);
      std::__cxx11::istringstream::~istringstream((istringstream *)&local_1b0);
      std::ios_base::~ios_base(local_138);
      if (local_1d0[0] != local_1c0) {
        operator_delete(local_1d0[0]);
      }
      if (0 < local_1f4) {
        opt->block = (long)local_1f4;
        *ptr = *ptr + 1;
        goto LAB_0010799e;
      }
      goto LAB_00107b24;
    }
LAB_00107add:
    lVar5 = 0x20;
    pcVar7 = "Missing block size in option --p";
LAB_00107ae9:
    plVar6 = &std::cout;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,lVar5);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&local_1f0);
    if (iVar3 == 0) {
      opt->verbose = true;
      goto LAB_0010799e;
    }
    iVar3 = std::__cxx11::string::compare((char *)&local_1f0);
    if (iVar3 == 0) {
      if (*ptr < argc) {
        std::__cxx11::string::string((string *)&local_1b0,argv[*ptr],(allocator *)local_1d0);
        if (local_1a8 == 1) {
          opt->sep = *local_1b0;
          *ptr = *ptr + 1;
          if (local_1b0 != local_1a0) {
            operator_delete(local_1b0);
          }
          goto LAB_0010799e;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Error: separator must be a single character.",0x2c);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
        std::ostream::put('@');
        std::ostream::flush();
        help();
        std::__throw_out_of_range_fmt
                  ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",0);
        goto LAB_00107add;
      }
      lVar5 = 0x29;
      pcVar7 = "Missing separator character in option --s";
      goto LAB_00107ae9;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Unrecognized option ",0x14);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_1f0,local_1e8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    plVar6 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  }
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  help();
LAB_00107b24:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"error: block size in --p must be > 0",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  help();
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

lz77_t::options parse(lz77_t::options &opt, int &ptr, char** argv, int argc){

	string s(argv[ptr]);
	ptr++;

	if(s.compare("--v1")==0){

		opt.lz_variant = lz77_t::v1;

	}else if(s.compare("--v2")==0){

		opt.lz_variant = lz77_t::v2;

	}else if(s.compare("--p")==0){

		if(ptr>=argc){
			cout<<"Missing block size in option --p" << endl;
			help();
		}

		int block_size;
		istringstream ( string(argv[ptr]) ) >> block_size;

		if(block_size<=0){
			cout << "error: block size in --p must be > 0" << endl;
			help();
		}

		opt.block=block_size;

		ptr++;

	}else if(s.compare("--verbose")==0){

		opt.verbose = true;

	}else if(s.compare("--s")==0){

		if(ptr>=argc){
			cout<<"Missing separator character in option --s" << endl;
			help();
		}

		string sep(argv[ptr]);

		if(sep.length()!=1){
			cout << "Error: separator must be a single character." << endl;
			help();
		}

		opt.sep = sep.at(0);
		ptr++;

	}else{

		cout << "Unrecognized option " << s<< endl << endl;
		help();
	}

	return opt;
}